

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTracerViewer.cpp
# Opt level: O0

void __thiscall
PathTracerViewer::create_descriptors(PathTracerViewer *this,shared_ptr<myvk::Device> *device)

{
  initializer_list<VkDescriptorPoolSize> __l;
  initializer_list<VkDescriptorSetLayoutBinding> __l_00;
  element_type *this_00;
  VkSampler immutable_samplers [1];
  VkDescriptorSetLayoutBinding binding;
  shared_ptr<myvk::DescriptorPool> *in_stack_fffffffffffffec8;
  shared_ptr<myvk::DescriptorPool> *this_01;
  vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *in_stack_fffffffffffffee0;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *this_02;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff04;
  iterator in_stack_ffffffffffffff08;
  size_type in_stack_ffffffffffffff10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  Ptr<DescriptorSetLayout> *pPStack_e0;
  Ptr<DescriptorPool> *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **local_c8;
  vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *bindings;
  Ptr<Device> *in_stack_ffffffffffffff48;
  Ptr<DescriptorPool> local_90;
  Ptr<DescriptorSetLayout> *pPVar1;
  Ptr<DescriptorPool> *descriptor_pool;
  allocator_type local_51;
  undefined4 local_50;
  undefined4 local_4c;
  undefined4 *local_48;
  undefined8 local_40;
  shared_ptr<myvk::DescriptorPool> local_20 [2];
  
  local_50 = 1;
  local_4c = 1;
  local_48 = &local_50;
  local_40 = 1;
  __a = &local_51;
  std::allocator<VkDescriptorPoolSize>::allocator((allocator<VkDescriptorPoolSize> *)0x175585);
  __l._M_len = in_stack_ffffffffffffff10;
  __l._M_array = (iterator)in_stack_ffffffffffffff08;
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::vector
            ((vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),__l,__a);
  myvk::DescriptorPool::Create
            ((Ptr<Device> *)in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
             (vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_> *)__a);
  this_01 = local_20;
  std::shared_ptr<myvk::DescriptorPool>::operator=(this_01,in_stack_fffffffffffffec8);
  std::shared_ptr<myvk::DescriptorPool>::~shared_ptr((shared_ptr<myvk::DescriptorPool> *)0x1755f2);
  std::vector<VkDescriptorPoolSize,_std::allocator<VkDescriptorPoolSize>_>::~vector
            (in_stack_fffffffffffffee0);
  std::allocator<VkDescriptorPoolSize>::~allocator(&local_51);
  local_90.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x100000000;
  pPVar1 = (Ptr<DescriptorSetLayout> *)0x1000000001;
  this_00 = std::__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<myvk::Sampler,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x17565d);
  pPStack_e0 = pPVar1;
  local_90.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)myvk::Sampler::GetHandle(this_00);
  local_d8 = &local_90;
  local_e8 = local_90.super___shared_ptr<myvk::DescriptorPool,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
  local_c8 = &local_e8;
  bindings = (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             0x1;
  this_02 = (vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
            &stack0xffffffffffffff17;
  pPVar1 = pPStack_e0;
  descriptor_pool = local_d8;
  std::allocator<VkDescriptorSetLayoutBinding>::allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)0x1756c6);
  __l_00._M_len = in_stack_ffffffffffffff10;
  __l_00._M_array = in_stack_ffffffffffffff08;
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::vector
            ((vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_> *)
             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),__l_00,
             (allocator_type *)__a);
  myvk::DescriptorSetLayout::Create(in_stack_ffffffffffffff48,bindings);
  std::shared_ptr<myvk::DescriptorSetLayout>::operator=
            ((shared_ptr<myvk::DescriptorSetLayout> *)this_01,
             (shared_ptr<myvk::DescriptorSetLayout> *)in_stack_fffffffffffffec8);
  std::shared_ptr<myvk::DescriptorSetLayout>::~shared_ptr
            ((shared_ptr<myvk::DescriptorSetLayout> *)0x175726);
  std::vector<VkDescriptorSetLayoutBinding,_std::allocator<VkDescriptorSetLayoutBinding>_>::~vector
            (this_02);
  std::allocator<VkDescriptorSetLayoutBinding>::~allocator
            ((allocator<VkDescriptorSetLayoutBinding> *)&stack0xffffffffffffff17);
  myvk::DescriptorSet::Create(descriptor_pool,pPVar1);
  std::shared_ptr<myvk::DescriptorSet>::operator=
            ((shared_ptr<myvk::DescriptorSet> *)this_01,
             (shared_ptr<myvk::DescriptorSet> *)in_stack_fffffffffffffec8);
  std::shared_ptr<myvk::DescriptorSet>::~shared_ptr((shared_ptr<myvk::DescriptorSet> *)0x17577d);
  return;
}

Assistant:

void PathTracerViewer::create_descriptors(const std::shared_ptr<myvk::Device> &device) {
	m_descriptor_pool = myvk::DescriptorPool::Create(device, 1, {{VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER, 1}});
	{
		VkDescriptorSetLayoutBinding binding = {};
		binding.binding = 0;
		binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
		binding.descriptorCount = 1;
		binding.stageFlags = VK_SHADER_STAGE_FRAGMENT_BIT;
		VkSampler immutable_samplers[] = {m_sampler->GetHandle()};
		binding.pImmutableSamplers = immutable_samplers;

		m_descriptor_set_layout = myvk::DescriptorSetLayout::Create(device, {binding});
	}
	m_descriptor_set = myvk::DescriptorSet::Create(m_descriptor_pool, m_descriptor_set_layout);
}